

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

wal_item * wal_itr_next(wal_iterator *wal_itr)

{
  avl_node *paVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  wal_item *pwVar5;
  snap_handle *psVar6;
  avl_node *paVar7;
  code *func;
  avl_node *paVar8;
  list_elem *plVar9;
  avl_node *paVar10;
  avl_node *paVar11;
  avl_node *paVar12;
  long lVar13;
  fdb_kvs_id_t kv_id;
  fdb_kvs_id_t local_70;
  avl_node local_68;
  avl_node *paStack_50;
  avl_node *local_48;
  avl_node *paStack_40;
  
  if (wal_itr->shandle->is_persisted_snapshot == true) {
    paVar3 = avl_next(wal_itr->cursor_pos);
    wal_itr->cursor_pos = paVar3;
    if (wal_itr->by_key == true) {
      pwVar5 = (wal_item *)&paVar3[-5].right;
    }
    else {
      pwVar5 = (wal_item *)&paVar3[-1].left;
    }
    if (paVar3 != (avl_node *)0x0) {
      return pwVar5;
    }
    return (wal_item *)0x0;
  }
  if (wal_itr->shandle->snap_tag_idx == 0) {
LAB_00142f75:
    pwVar5 = (wal_item *)0x0;
  }
  else {
    if (wal_itr->direction == '\x01') {
      paVar3 = wal_itr->cursor_pos;
      if (paVar3 == (avl_node *)0x0) goto LAB_00142f75;
      if (wal_itr->by_key == true) {
        local_68.parent = paVar3->parent;
        local_68.left = paVar3->left;
        local_68.right = paVar3->right;
        paStack_50 = paVar3[1].parent;
        local_48 = paVar3[1].left;
        paStack_40 = paVar3[1].right;
        paVar4 = paStack_50[1].right;
        lVar13 = (long)paVar3 - (long)wal_itr->cursors;
        wal_itr->item_prev = (wal_item *)paVar3[1].parent;
        pthread_spin_lock((pthread_spinlock_t *)((long)&wal_itr->map_shards->lock + (lVar13 >> 1)));
        avl_set_aux((avl_tree *)((long)&(wal_itr->map_shards->_map).root + (lVar13 >> 1)),
                    &wal_itr->shandle->cmp_info);
        paVar4 = avl_next(paVar4);
        if (paVar4 != (avl_node *)0x0) {
          do {
            if (wal_itr->multi_kvs == false) {
              psVar6 = wal_itr->shandle;
            }
            else {
              buf2kvid((ulong)*(byte *)((long)&paVar4[1].left + 2),paVar4[1].parent,&local_70);
              psVar6 = wal_itr->shandle;
              if (local_70 != psVar6->id) break;
            }
            paVar7 = paVar4[1].right;
            if (paVar7 != (avl_node *)0x0) {
              paVar12 = (avl_node *)psVar6->snap_tag_idx;
              paVar11 = (avl_node *)0x0;
              do {
                paVar8 = paVar11;
                if (((paVar7[2].left == (avl_node *)psVar6->snap_txn->txn_id) ||
                    (((ulong)paVar7[3].parent & 0x100) != 0)) &&
                   (paVar7[2].right[1].left <= paVar12)) {
                  if (((((ulong)paVar7[3].parent & 0x100) != 0) &&
                      ((fdb_txn *)paVar7[2].parent != psVar6->global_txn)) &&
                     (((fdb_txn *)paVar7[2].parent != psVar6->snap_txn &&
                      (plVar9 = (psVar6->active_txn_list).head, plVar9 != (list_elem *)0x0)))) {
                    do {
                      if ((avl_node *)plVar9[1].prev == paVar7[2].left) goto LAB_00142ee9;
                      plVar9 = plVar9->next;
                    } while (plVar9 != (list_elem *)0x0);
                  }
                  paVar1 = paVar7[2].right[1].left;
                  if (paVar1 == paVar12) goto LAB_00143158;
                  if ((((avl_node *)psVar6->snap_stop_idx < paVar1) && (paVar1 < paVar12)) &&
                     ((paVar8 = paVar7, paVar11 != (avl_node *)0x0 &&
                      (paVar8 = paVar11, paVar11[2].right[1].left < paVar1)))) {
                    paVar8 = paVar7;
                  }
                }
LAB_00142ee9:
                paVar7 = paVar7->left;
                paVar11 = paVar8;
              } while (paVar7 != (avl_node *)0x0);
              paVar7 = paVar8;
              if (paVar8 != (avl_node *)0x0) goto LAB_00143158;
            }
            paVar4 = avl_next(paVar4);
            if (paVar4 == (avl_node *)0x0) break;
          } while( true );
        }
        paVar7 = (avl_node *)0x0;
LAB_00143158:
        pthread_spin_unlock(&wal_itr->map_shards->lock + (lVar13 >> 4) * 2);
        avl_remove(&wal_itr->merge_tree,paVar3);
        paVar3 = (avl_node *)(lVar13 + (long)wal_itr->cursors);
        if (paVar7 == (avl_node *)0x0) {
          paVar3[1].parent = (avl_node *)0x0;
        }
        else {
          paVar3[1].parent = paVar7;
          avl_insert(&wal_itr->merge_tree,paVar3,_merge_cmp_bykey);
        }
        func = _merge_cmp_bykey;
      }
      else {
        local_68.parent = paVar3->parent;
        local_68.left = paVar3->left;
        local_68.right = paVar3->right;
        paStack_50 = paVar3[1].parent;
        local_48 = paVar3[1].left;
        paStack_40 = paVar3[1].right;
        lVar13 = (long)paVar3 - (long)wal_itr->cursors;
        wal_itr->item_prev = (wal_item *)paVar3[1].parent;
        pthread_spin_lock((pthread_spinlock_t *)((long)&wal_itr->map_shards->lock + (lVar13 >> 1)));
        for (paVar4 = avl_next((avl_node *)&paStack_50->right); paVar4 != (avl_node *)0x0;
            paVar4 = avl_next(paVar4)) {
          if (wal_itr->multi_kvs == false) {
            psVar6 = wal_itr->shandle;
          }
          else {
            buf2kvid((ulong)*(byte *)((long)&paVar4[1].parent[1].left + 2),
                     paVar4[1].parent[1].parent,&local_70);
            psVar6 = wal_itr->shandle;
            if (local_70 != psVar6->id) break;
          }
          paVar7 = paVar4[1].parent[1].right;
          if (paVar7 != (avl_node *)0x0) {
            paVar12 = (avl_node *)&paVar4[-1].left;
            paVar11 = (avl_node *)psVar6->snap_tag_idx;
            paVar8 = (avl_node *)0x0;
            do {
              paVar1 = paVar8;
              if (((paVar7[2].left == (avl_node *)psVar6->snap_txn->txn_id) ||
                  (((ulong)paVar7[3].parent & 0x100) != 0)) && (paVar7[2].right[1].left <= paVar11))
              {
                if (((((ulong)paVar7[3].parent & 0x100) != 0) &&
                    ((fdb_txn *)paVar7[2].parent != psVar6->global_txn)) &&
                   (((fdb_txn *)paVar7[2].parent != psVar6->snap_txn &&
                    (plVar9 = (psVar6->active_txn_list).head, plVar9 != (list_elem *)0x0)))) {
                  do {
                    if ((avl_node *)plVar9[1].prev == paVar7[2].left) goto LAB_001430a3;
                    plVar9 = plVar9->next;
                  } while (plVar9 != (list_elem *)0x0);
                }
                paVar2 = paVar7[2].right[1].left;
                paVar10 = paVar7;
                if (paVar2 == paVar11) break;
                if ((((avl_node *)psVar6->snap_stop_idx < paVar2) && (paVar2 < paVar11)) &&
                   ((paVar1 = paVar7, paVar8 != (avl_node *)0x0 &&
                    (paVar1 = paVar8, paVar8[2].right[1].left < paVar2)))) {
                  paVar1 = paVar7;
                }
              }
LAB_001430a3:
              paVar8 = paVar1;
              paVar7 = paVar7->left;
              paVar10 = paVar8;
            } while (paVar7 != (avl_node *)0x0);
            if (paVar12 == paVar10) goto LAB_001430fc;
          }
        }
        paVar12 = (avl_node *)0x0;
LAB_001430fc:
        pthread_spin_unlock(&wal_itr->map_shards->lock + (lVar13 >> 4) * 2);
        avl_remove(&wal_itr->merge_tree,paVar3);
        paVar3 = (avl_node *)(lVar13 + (long)wal_itr->cursors);
        if (paVar12 == (avl_node *)0x0) {
          paVar3[1].parent = (avl_node *)0x0;
        }
        else {
          paVar3[1].parent = paVar12;
          avl_insert(&wal_itr->merge_tree,paVar3,_merge_cmp_byseq);
        }
        func = _merge_cmp_byseq;
      }
      paVar3 = avl_search_greater(&wal_itr->merge_tree,&local_68,func);
      wal_itr->cursor_pos = paVar3;
      if (paVar3 == (avl_node *)0x0) {
        pwVar5 = (wal_item *)0x0;
      }
      else {
        pwVar5 = (wal_item *)paVar3[1].parent;
      }
    }
    else {
      pwVar5 = wal_itr->item_prev;
      if (pwVar5 == (wal_item *)0x0) goto LAB_00142f75;
      if (wal_itr->by_key == true) {
        pwVar5 = _wal_itr_search_greater_bykey(wal_itr,pwVar5);
      }
      else {
        pwVar5 = _wal_itr_search_greater_byseq(wal_itr,pwVar5);
      }
    }
    wal_itr->direction = '\x01';
  }
  return pwVar5;
}

Assistant:

struct wal_item* wal_itr_next(struct wal_iterator *wal_itr)
{
    struct wal_item *result = NULL;
    if (wal_itr->shandle->is_persisted_snapshot) {
        wal_itr->cursor_pos = avl_next(wal_itr->cursor_pos);
        if (wal_itr->by_key) {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_keysnap) : NULL;
        } else {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_seq) : NULL;
        }
    }

    if (!wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        return NULL;
    }
    if (wal_itr->direction == FDB_ITR_FORWARD) {
        if (!wal_itr->cursor_pos) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_next_bykey(wal_itr);
        } else {
            result = _wal_itr_next_byseq(wal_itr);
        }
    } else { // change of direction involves searching across all shards..
        if (!wal_itr->item_prev) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_search_greater_bykey(wal_itr,
                                                   wal_itr->item_prev);
        } else {
            result = _wal_itr_search_greater_byseq(wal_itr,
                                                   wal_itr->item_prev);
        }
    }
    wal_itr->direction = FDB_ITR_FORWARD;
    return result;
}